

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t DwaCompressor_classifyChannels(DwaCompressor *me)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined8 uVar7;
  void *__s;
  CscPrefixMapItem *pCVar8;
  int *piVar9;
  long in_RDI;
  int blu;
  int grn;
  int red;
  CscChannelSet *cset;
  exr_coding_channel_info_t *bluc;
  exr_coding_channel_info_t *grnc;
  exr_coding_channel_info_t *redc;
  int c_1;
  size_t i;
  CscPrefixMapItem *mapi;
  char *suffix;
  exr_coding_channel_info_t *curc;
  int c;
  CscPrefixMapItem *prefixMap;
  undefined4 in_stack_ffffffffffffff88;
  exr_pixel_type_t in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Classifier *in_stack_ffffffffffffff98;
  CscPrefixMapItem *in_stack_ffffffffffffffa0;
  int local_44;
  ulong local_40;
  int local_1c;
  exr_result_t local_4;
  
  uVar7 = (**(code **)(in_RDI + 0xb8))((long)*(int *)(in_RDI + 0x28) * 0xc);
  *(undefined8 *)(in_RDI + 0x38) = uVar7;
  if (*(long *)(in_RDI + 0x38) == 0) {
    local_4 = 1;
  }
  else {
    __s = (void *)(**(code **)(in_RDI + 0xb8))((long)*(int *)(in_RDI + 0x28) << 5);
    if (__s == (void *)0x0) {
      local_4 = 1;
    }
    else {
      memset(__s,0,(long)*(int *)(in_RDI + 0x28) << 5);
      for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x28); local_1c = local_1c + 1) {
        Classifier_find_suffix
                  ((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        pCVar8 = CscPrefixMap_find(in_stack_ffffffffffffffa0,
                                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                   (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90),
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        for (local_40 = 0; local_40 < *(ulong *)(in_RDI + 0x50); local_40 = local_40 + 1) {
          iVar6 = Classifier_match(in_stack_ffffffffffffff98,
                                   (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90),
                                   in_stack_ffffffffffffff8c);
          if ((iVar6 != 0) &&
             (*(undefined4 *)(*(long *)(in_RDI + 0x30) + (long)local_1c * 0x240 + 0x224) =
                   *(undefined4 *)(*(long *)(in_RDI + 0x48) + local_40 * 0x18 + 8),
             -1 < *(int *)(*(long *)(in_RDI + 0x48) + local_40 * 0x18 + 0x10))) {
            pCVar8->idx[*(int *)(*(long *)(in_RDI + 0x48) + local_40 * 0x18 + 0x10)] = local_1c;
          }
        }
      }
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x28); local_44 = local_44 + 1) {
        iVar6 = *(int *)((long)__s + (long)local_44 * 0x20 + 0x10);
        iVar1 = *(int *)((long)__s + (long)local_44 * 0x20 + 0x14);
        iVar2 = *(int *)((long)__s + (long)local_44 * 0x20 + 0x18);
        if (*(long *)((long)__s + (long)local_44 * 0x20) == 0) break;
        if (((-1 < iVar6) && (-1 < iVar1)) && (-1 < iVar2)) {
          lVar3 = *(long *)(*(long *)(in_RDI + 0x30) + (long)iVar6 * 0x240 + 0x1c0);
          lVar4 = *(long *)(*(long *)(in_RDI + 0x30) + (long)iVar1 * 0x240 + 0x1c0);
          lVar5 = *(long *)(*(long *)(in_RDI + 0x30) + (long)iVar2 * 0x240 + 0x1c0);
          if ((((*(int *)(lVar3 + 0x10) == *(int *)(lVar4 + 0x10)) &&
               (*(int *)(lVar3 + 0x10) == *(int *)(lVar5 + 0x10))) &&
              ((*(int *)(lVar4 + 0x10) == *(int *)(lVar5 + 0x10) &&
               ((*(int *)(lVar3 + 0x14) == *(int *)(lVar4 + 0x14) &&
                (*(int *)(lVar3 + 0x14) == *(int *)(lVar5 + 0x14))))))) &&
             (*(int *)(lVar4 + 0x14) == *(int *)(lVar5 + 0x14))) {
            piVar9 = (int *)(*(long *)(in_RDI + 0x38) + (long)*(int *)(in_RDI + 0x2c) * 0xc);
            *piVar9 = iVar6;
            piVar9[1] = iVar1;
            piVar9[2] = iVar2;
            *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + 1;
          }
        }
      }
      (**(code **)(in_RDI + 0xc0))(__s);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
DwaCompressor_classifyChannels (DwaCompressor* me)
{
    CscPrefixMapItem* prefixMap;
    //
    // prefixMap used to map channel name prefixes to
    // potential CSC-able sets of channels.
    //

    me->_cscChannelSets =
        me->alloc_fn (sizeof (CscChannelSet) * (size_t) me->_numChannels);
    if (!me->_cscChannelSets) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Try and figure out which channels should be
    // compressed by which means.
    //
    prefixMap =
        me->alloc_fn (sizeof (CscPrefixMapItem) * (size_t) me->_numChannels);
    if (!prefixMap) return EXR_ERR_OUT_OF_MEMORY;

    memset (
        prefixMap, 0, sizeof (CscPrefixMapItem) * (size_t) me->_numChannels);
    for (int c = 0; c < me->_numChannels; ++c)
    {
        const exr_coding_channel_info_t* curc = me->_channelData[c].chan;
        const char*       suffix = Classifier_find_suffix (curc->channel_name);
        CscPrefixMapItem* mapi   = CscPrefixMap_find (
            prefixMap,
            me->_numChannels,
            curc->channel_name,
            (size_t) (suffix - curc->channel_name));

        for (size_t i = 0; i < me->_channelRuleCount; ++i)
        {
            if (Classifier_match (
                    &(me->_channelRules[i]),
                    suffix,
                    (exr_pixel_type_t) curc->data_type))
            {
                me->_channelData[c].compression = me->_channelRules[i]._scheme;

                if (me->_channelRules[i]._cscIdx >= 0)
                    mapi->idx[me->_channelRules[i]._cscIdx] = c;
            }
        }
    }

    //
    // Finally, try and find RGB sets of channels which
    // can be CSC'ed to a Y'CbCr space prior to loss, for
    // better compression.
    //
    // Walk over our set of candidates, and see who has
    // all three channels defined (and has common sampling
    // patterns, etc).
    //

    for (int c = 0; c < me->_numChannels; ++c)
    {
        const exr_coding_channel_info_t *redc, *grnc, *bluc;
        CscChannelSet*                   cset;
        int                              red = prefixMap[c].idx[0];
        int                              grn = prefixMap[c].idx[1];
        int                              blu = prefixMap[c].idx[2];

        if (prefixMap[c].name == NULL) break;

        if ((red < 0) || (grn < 0) || (blu < 0)) continue;

        redc = me->_channelData[red].chan;
        grnc = me->_channelData[grn].chan;
        bluc = me->_channelData[blu].chan;

        if ((redc->x_samples != grnc->x_samples) ||
            (redc->x_samples != bluc->x_samples) ||
            (grnc->x_samples != bluc->x_samples) ||
            (redc->y_samples != grnc->y_samples) ||
            (redc->y_samples != bluc->y_samples) ||
            (grnc->y_samples != bluc->y_samples))
        {
            continue;
        }

        cset         = me->_cscChannelSets + me->_numCscChannelSets;
        cset->idx[0] = red;
        cset->idx[1] = grn;
        cset->idx[2] = blu;
        ++(me->_numCscChannelSets);
    }
    me->free_fn (prefixMap);

    return EXR_ERR_SUCCESS;
}